

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::PushZeroPageEntry(ZeroPageQueue *this,FreePageEntry *entry)

{
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  FreePageEntry *entry_local;
  ZeroPageQueue *this_local;
  
  autoCS.cs = (CriticalSection *)entry;
  AutoCriticalSection::AutoCriticalSection
            (&local_20,&(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection);
  *(FreePageEntry **)((autoCS.cs)->super_CCLock).mutexPtr = this->pendingZeroPageList;
  this->pendingZeroPageList = (FreePageEntry *)autoCS.cs;
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return;
}

Assistant:

void PushZeroPageEntry(FreePageEntry* entry)
        {
#if SUPPORT_WIN32_SLIST
            ::InterlockedPushEntrySList(&pendingZeroPageList, entry);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            entry->Next = pendingZeroPageList;
            pendingZeroPageList = entry;
#endif
        }